

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessageTime::LogMessageTime(LogMessageTime *this,time_point now)

{
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> _Var1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98;
  duration<long,_std::ratio<1L,_1000000000L>_> local_90 [2];
  tuple<tm_&,_long_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&> local_80;
  enable_if_t<has_member_tm_gmtoff<tm>::value,_std::tuple<std::tm,_std::time_t,_std::chrono::hours>_>
  local_68;
  time_t local_20;
  time_t timestamp;
  LogMessageTime *this_local;
  time_point now_local;
  
  (this->tm_).tm_sec = 0;
  (this->tm_).tm_min = 0;
  (this->tm_).tm_hour = 0;
  (this->tm_).tm_mday = 0;
  (this->tm_).tm_mon = 0;
  (this->tm_).tm_year = 0;
  (this->tm_).tm_wday = 0;
  (this->tm_).tm_yday = 0;
  (this->tm_).tm_isdst = 0;
  (this->tm_).tm_gmtoff = 0;
  (this->tm_).tm_zone = (char *)0x0;
  (this->timestamp_).__d.__r = (rep)now.__d.__r;
  timestamp = (time_t)this;
  this_local = (LogMessageTime *)now.__d.__r;
  anon_unknown_8::Breakdown<tm>(&local_68,(time_point *)&this_local);
  std::tie<tm,long,std::chrono::duration<long,std::ratio<1l,1l>>>
            (&local_80,&this->tm_,&local_20,&this->gmtoffset_);
  std::tuple<tm&,long&,std::chrono::duration<long,std::ratio<1l,1l>>&>::operator=
            ((tuple<tm&,long&,std::chrono::duration<long,std::ratio<1l,1l>>&> *)&local_80,&local_68)
  ;
  local_98.__d.__r = (duration)std::chrono::_V2::system_clock::from_time_t(local_20);
  local_90[0].__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&this_local,&local_98);
  _Var1 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                    (local_90);
  (this->usecs_).__r = _Var1.__r;
  return;
}

Assistant:

LogMessageTime::LogMessageTime(std::chrono::system_clock::time_point now)
    : timestamp_{now} {
  std::time_t timestamp;
  std::tie(tm_, timestamp, gmtoffset_) = Breakdown(now);
  usecs_ = std::chrono::duration_cast<std::chrono::microseconds>(
      now - std::chrono::system_clock::from_time_t(timestamp));
}